

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

triplet<unsigned_char> __thiscall
charls::
jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::encoder_strategy>::
encode_run_interruption_pixel
          (jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::encoder_strategy>
           *this,triplet<unsigned_char> x,triplet<unsigned_char> ra,triplet<unsigned_char> rb)

{
  anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 aVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int32_t error_value;
  int32_t error_value_00;
  int32_t error_value_01;
  reference pvVar6;
  undefined5 in_register_0000000b;
  uchar *puVar7;
  undefined5 in_register_00000013;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  size_t *siglen_02;
  size_t *siglen_03;
  undefined5 in_register_00000033;
  uchar *puVar8;
  array<charls::context_run_mode,_2UL> *this_00;
  size_t in_R8;
  triplet<unsigned_char> local_30;
  int32_t error_value3;
  int32_t error_value2;
  int32_t error_value1;
  jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::encoder_strategy>
  *this_local;
  anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 aStack_10;
  anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1 local_e;
  anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 aStack_d;
  triplet<unsigned_char> rb_local;
  triplet<unsigned_char> ra_local;
  triplet<unsigned_char> x_local;
  
  puVar7 = (uchar *)(CONCAT53(in_register_00000033,x) >> 0x10 & 0xffff);
  rb_local.field_0.v1 = (uchar)puVar7;
  aVar1 = rb.field_2;
  this_local._4_1_ = rb.field_0;
  this_local._7_1_ = ra.field_0;
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)((uint)this_local._4_1_ - (uint)this_local._7_1_),
                       puVar7,(size_t *)CONCAT53(in_register_00000013,ra),
                       (uchar *)CONCAT53(in_register_0000000b,rb),in_R8);
  local_e = x.field_0;
  puVar7 = (uchar *)(ulong)this_local._4_1_;
  error_value = lossless_traits_impl<unsigned_char,_8>::compute_error_value
                          (iVar5 * ((uint)local_e.v1 - (uint)this_local._4_1_));
  this_00 = &this->context_run_mode_;
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_00,0);
  encode_run_interruption_error(this,pvVar6,error_value);
  this_local._5_1_ = rb.field_1;
  aStack_10 = ra.field_1;
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)((uint)this_local._5_1_ - (uint)aStack_10.v2),
                       (uchar *)pvVar6,siglen,puVar7,in_R8);
  aStack_d = x.field_1;
  puVar7 = (uchar *)(ulong)this_local._5_1_;
  error_value_00 =
       lossless_traits_impl<unsigned_char,_8>::compute_error_value
                 (iVar5 * ((uint)aStack_d.v2 - (uint)this_local._5_1_));
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_00,0);
  encode_run_interruption_error(this,pvVar6,error_value_00);
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)((uint)aVar1.v3 - (uint)ra.field_2.v3),(uchar *)pvVar6
                       ,siglen_00,puVar7,in_R8);
  puVar7 = (uchar *)(ulong)aVar1.v3;
  error_value_01 =
       lossless_traits_impl<unsigned_char,_8>::compute_error_value
                 (iVar5 * ((uint)rb_local.field_0.v1 - (uint)aVar1.v3));
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_00,0);
  encode_run_interruption_error(this,pvVar6,error_value_01);
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)((uint)this_local._4_1_ - (uint)this_local._7_1_),
                       (uchar *)pvVar6,siglen_01,puVar7,in_R8);
  puVar8 = (uchar *)(ulong)(uint)(error_value * iVar5);
  bVar2 = lossless_traits<charls::triplet<unsigned_char>,_8>::compute_reconstructed_sample
                    ((uint)this_local._4_1_,error_value * iVar5);
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)((uint)this_local._5_1_ - (uint)aStack_10.v2),puVar8,
                       siglen_02,puVar7,in_R8);
  puVar8 = (uchar *)(ulong)(uint)(error_value_00 * iVar5);
  bVar3 = lossless_traits<charls::triplet<unsigned_char>,_8>::compute_reconstructed_sample
                    ((uint)this_local._5_1_,error_value_00 * iVar5);
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)((uint)aVar1.v3 - (uint)ra.field_2.v3),puVar8,
                       siglen_03,puVar7,in_R8);
  bVar4 = lossless_traits<charls::triplet<unsigned_char>,_8>::compute_reconstructed_sample
                    ((uint)aVar1.v3,error_value_01 * iVar5);
  triplet<unsigned_char>::triplet
            ((triplet<unsigned_char> *)&rb_local.field_1,(uint)bVar2,(uint)bVar3,(uint)bVar4);
  local_30.field_2.v3 = ra_local.field_0.v1;
  local_30.field_0.v1 = rb_local.field_1.v2;
  local_30.field_1.v2 = rb_local.field_2.v3;
  return local_30;
}

Assistant:

triplet<sample_type> encode_run_interruption_pixel(const triplet<sample_type> x, const triplet<sample_type> ra,
                                                       const triplet<sample_type> rb)
    {
        const int32_t error_value1{traits_.compute_error_value(sign(rb.v1 - ra.v1) * (x.v1 - rb.v1))};
        encode_run_interruption_error(context_run_mode_[0], error_value1);

        const int32_t error_value2{traits_.compute_error_value(sign(rb.v2 - ra.v2) * (x.v2 - rb.v2))};
        encode_run_interruption_error(context_run_mode_[0], error_value2);

        const int32_t error_value3{traits_.compute_error_value(sign(rb.v3 - ra.v3) * (x.v3 - rb.v3))};
        encode_run_interruption_error(context_run_mode_[0], error_value3);

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }